

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v11::detail::bigint::assign_pow10(bigint *this,int exp)

{
  int n;
  int iVar1;
  uint32_t in_ESI;
  bigint *in_RDI;
  int unaff_retaddr;
  bigint *in_stack_00000008;
  int bitmask;
  bigint *in_stack_00000130;
  int in_stack_ffffffffffffffdc;
  uint local_14;
  bool local_d;
  uint32_t local_c;
  
  local_d = -1 < (int)in_ESI;
  local_c = in_ESI;
  ignore_unused<bool,char[1]>(&local_d,(char (*) [1])0x2c5fea);
  if (local_c == 0) {
    operator=(in_RDI,in_stack_ffffffffffffffdc);
  }
  else {
    n = num_bits<unsigned_int>();
    iVar1 = countl_zero(local_c);
    local_14 = 1 << (((char)n - (char)iVar1) - 1U & 0x1f);
    operator=(in_RDI,n);
    while (local_14 = (int)local_14 >> 1, local_14 != 0) {
      square(in_stack_00000130);
      if ((local_c & local_14) != 0) {
        operator*=(in_RDI,n);
      }
    }
    operator<<=(in_stack_00000008,unaff_retaddr);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void assign_pow10(int exp) {
    FMT_ASSERT(exp >= 0, "");
    if (exp == 0) return *this = 1;
    int bitmask = 1 << (num_bits<unsigned>() -
                        countl_zero(static_cast<uint32_t>(exp)) - 1);
    // pow(10, exp) = pow(5, exp) * pow(2, exp). First compute pow(5, exp) by
    // repeated squaring and multiplication.
    *this = 5;
    bitmask >>= 1;
    while (bitmask != 0) {
      square();
      if ((exp & bitmask) != 0) *this *= 5;
      bitmask >>= 1;
    }
    *this <<= exp;  // Multiply by pow(2, exp) by shifting.
  }